

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolarPosition.cc
# Opt level: O1

Eci * __thiscall
libsgp4::SolarPosition::FindPosition(Eci *__return_storage_ptr__,SolarPosition *this,DateTime *dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = (double)dt->m_encoded / 86400000000.0 + 1721425.5 + -2415020.0;
  dVar2 = dVar1 / 365.25 + 1900.0;
  dVar3 = sin(((dVar2 + -1975.0) * 6.283185307179586) / 33.0);
  dVar1 = ((dVar3 * 1.886913 + (dVar2 + -1950.0) * 0.747622 + 26.465) / 86400.0 + dVar1) / 36525.0;
  dVar2 = floor((dVar1 * 35999.04975) / 360.0);
  dVar2 = (dVar2 * -360.0 + dVar1 * 35999.04975 + 358.47583) -
          (dVar1 * 3.3e-06 + 0.00015) * dVar1 * dVar1;
  dVar3 = floor(dVar2 / 360.0);
  dVar2 = ((dVar3 * -360.0 + dVar2) * 3.141592653589793) / 180.0;
  dVar3 = floor((dVar1 * 36000.76892) / 360.0);
  dVar3 = dVar3 * -360.0 + dVar1 * 36000.76892 + 279.69668 + dVar1 * 0.0003025 * dVar1;
  dVar4 = floor(dVar3 / 360.0);
  dVar8 = 0.01675104 - (dVar1 * 1.26e-07 + 4.18e-05) * dVar1;
  dVar5 = sin(dVar2);
  dVar6 = sin(dVar2 + dVar2);
  dVar7 = sin(dVar2 * 3.0);
  dVar7 = ((dVar7 * 0.000293 +
           dVar6 * (dVar1 * -0.0001 + 0.020094) +
           dVar5 * (1.91946 - (dVar1 * 1.4e-05 + 0.004789) * dVar1)) * 3.141592653589793) / 180.0;
  dVar5 = dVar1 * -1934.142 + 259.18;
  dVar6 = floor(dVar5 / 360.0);
  dVar6 = ((dVar6 * -360.0 + dVar5) * 3.141592653589793) / 180.0;
  dVar5 = sin(dVar6);
  dVar4 = (((dVar4 * -360.0 + dVar3) * 3.141592653589793) / 180.0 + dVar7) -
          ((dVar5 * -0.00479 + 0.00569) * 3.141592653589793) / 180.0;
  dVar3 = floor(dVar4 / 6.283185307179586);
  dVar4 = dVar3 * -6.283185307179586 + dVar4;
  dVar7 = dVar7 + dVar2;
  dVar2 = floor(dVar7 / 6.283185307179586);
  dVar2 = cos(dVar2 * -6.283185307179586 + dVar7);
  dVar3 = cos(dVar6);
  dVar1 = ((dVar3 * 0.00256 +
           (23.452294 - ((dVar1 * -5.03e-07 + 1.64e-06) * dVar1 + 0.0130125) * dVar1)) *
          3.141592653589793) / 180.0;
  dVar2 = (((1.0 - dVar8 * dVar8) * 1.0000002) / (dVar2 * dVar8 + 1.0)) * 149597870.691;
  dVar3 = cos(dVar4);
  dVar5 = sin(dVar4);
  dVar6 = cos(dVar1);
  dVar4 = sin(dVar4);
  dVar1 = sin(dVar1);
  (__return_storage_ptr__->m_dt).m_encoded = dt->m_encoded;
  (__return_storage_ptr__->m_position).x = 0.0;
  (__return_storage_ptr__->m_position).y = 0.0;
  (__return_storage_ptr__->m_position).z = 0.0;
  (__return_storage_ptr__->m_position).w = 0.0;
  (__return_storage_ptr__->m_position).x = dVar3 * dVar2;
  (__return_storage_ptr__->m_position).y = dVar6 * dVar5 * dVar2;
  (__return_storage_ptr__->m_position).z = dVar1 * dVar4 * dVar2;
  (__return_storage_ptr__->m_position).w = dVar2;
  (__return_storage_ptr__->m_velocity).z = 0.0;
  (__return_storage_ptr__->m_velocity).w = 0.0;
  (__return_storage_ptr__->m_velocity).x = 0.0;
  (__return_storage_ptr__->m_velocity).y = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Eci SolarPosition::FindPosition(const DateTime& dt)
{
    const double mjd = dt.ToJ2000();
    const double year = 1900 + mjd / 365.25;
    const double T = (mjd + Delta_ET(year) / kSECONDS_PER_DAY) / 36525.0;
    const double M = Util::DegreesToRadians(Util::Wrap360(358.47583
                + Util::Wrap360(35999.04975 * T)
                - (0.000150 + 0.0000033 * T) * T * T));
    const double L = Util::DegreesToRadians(Util::Wrap360(279.69668
                + Util::Wrap360(36000.76892 * T)
                + 0.0003025 * T*T));
    const double e = 0.01675104 - (0.0000418 + 0.000000126 * T) * T;
    const double C = Util::DegreesToRadians((1.919460
                - (0.004789 + 0.000014 * T) * T) * sin(M)
                + (0.020094 - 0.000100 * T) * sin(2 * M)
                + 0.000293 * sin(3 * M));
    const double O = Util::DegreesToRadians(
            Util::Wrap360(259.18 - 1934.142 * T));
    const double Lsa = Util::WrapTwoPI(L + C
            - Util::DegreesToRadians(0.00569 - 0.00479 * sin(O)));
    const double nu = Util::WrapTwoPI(M + C);
    double R = 1.0000002 * (1 - e * e) / (1 + e * cos(nu));
    const double eps = Util::DegreesToRadians(23.452294 - (0.0130125
                + (0.00000164 - 0.000000503 * T) * T) * T + 0.00256 * cos(O));
    R = R * kAU;

    Vector solar_position(R * cos(Lsa),
            R * sin(Lsa) * cos(eps),
            R * sin(Lsa) * sin(eps),
            R);

    return Eci(dt, solar_position);
}